

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkLock.h
# Opt level: O1

void __thiscall chrono::ChLinkLockPointLine::~ChLinkLockPointLine(ChLinkLockPointLine *this)

{
  ChLinkLock::~ChLinkLock(&this->super_ChLinkLock);
  free((void *)this[-1].super_ChLinkLock.Ct_temp.rot.m_data[3]);
  return;
}

Assistant:

class ChApi ChLinkLockPointLine : public ChLinkLock {
  public:
    ChLinkLockPointLine() { ChangeLinkType(LinkType::POINTLINE); }

    /// "Virtual" copy constructor (covariant return type).
    virtual ChLinkLockPointLine* Clone() const override { return new ChLinkLockPointLine(*this); }

    /// Lock the joint.
    /// If enabled (lock = true) this effectively converts this joint into a weld joint.
    /// If lock = false, the joint reverts to its original degrees of freedom.
    void Lock(bool lock);
}